

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::equalityExpr(Parser *this,TokIter *iter,TokIter end)

{
  _Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Expression> sVar1;
  OpType local_a8;
  TokenID local_a4;
  OpType local_a0;
  TokenID local_9c;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_98;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_90;
  initializer_list<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_> local_88;
  SmallMap<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_78;
  Parser *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  _Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
  *local_30;
  Token *local_28;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  local_58 = relationExpr;
  local_50 = 0;
  local_60 = (Parser *)iter;
  local_30 = in_RCX;
  local_28 = end._M_current;
  iter_local = iter;
  end_local._M_current = (Token *)this;
  std::
  bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*)(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>),mocker::Parser*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_48,(offset_in_Parser_to_subr *)&local_58,&local_60,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  local_9c = NotEqual;
  local_a0 = Ne;
  std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>::
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType,_true>(&local_98,&local_9c,&local_a0);
  local_a4 = Equal;
  local_a8 = Eq;
  std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>::
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType,_true>(&local_90,&local_a4,&local_a8);
  local_88._M_len = 2;
  local_88._M_array = &local_98;
  SmallMap<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>::SmallMap(&local_78,&local_88);
  auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
            (this,iter,end,local_30,
             (SmallMap<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> *)&local_48);
  SmallMap<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>::~SmallMap(&local_78);
  sVar1.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar1.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::equalityExpr(TokIter &iter,
                                                      TokIter end) {
  namespace ph = std::placeholders;
  return auxBinaryExpr(iter, end,
                       std::bind(&Parser::relationExpr, this, ph::_1, ph::_2),
                       {{TokenID::NotEqual, ast::BinaryExpr::Ne},
                        {TokenID::Equal, ast::BinaryExpr::Eq}});
}